

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSat.c
# Opt level: O2

void Cec2_ObjAddToFrontier(Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Ptr_t *vFrontier,satoko_t *pSat)

{
  Vec_Int_t *p_00;
  int iVar1;
  int Entry;
  
  if (((ulong)pObj & 1) != 0) {
    __assert_fail("!Gia_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/proof/cec/cecSat.c"
                  ,0x131,
                  "void Cec2_ObjAddToFrontier(Gia_Man_t *, Gia_Obj_t *, Vec_Ptr_t *, satoko_t *)");
  }
  if ((~*(ulong *)pObj & 0x1fffffff1fffffff) == 0) {
    __assert_fail("!Gia_ObjIsConst0(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/proof/cec/cecSat.c"
                  ,0x132,
                  "void Cec2_ObjAddToFrontier(Gia_Man_t *, Gia_Obj_t *, Vec_Ptr_t *, satoko_t *)");
  }
  iVar1 = Cec2_ObjSatId(p,pObj);
  if (iVar1 < 0) {
    iVar1 = Cec2_ObjSatId(p,pObj);
    if (iVar1 != -1) {
      __assert_fail("Cec2_ObjSatId(p, pObj) == -1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/proof/cec/cecSat.c"
                    ,0x135,
                    "void Cec2_ObjAddToFrontier(Gia_Man_t *, Gia_Obj_t *, Vec_Ptr_t *, satoko_t *)")
      ;
    }
    iVar1 = satoko_add_variable(pSat,'\0');
    p_00 = p->vVar2Obj;
    if (p_00 != (Vec_Int_t *)0x0) {
      if (p_00->nSize != iVar1) {
        __assert_fail("Vec_IntSize(p->vVar2Obj) == iVar",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/proof/cec/cecSat.c"
                      ,0x139,
                      "void Cec2_ObjAddToFrontier(Gia_Man_t *, Gia_Obj_t *, Vec_Ptr_t *, satoko_t *)"
                     );
      }
      Entry = Gia_ObjId(p,pObj);
      Vec_IntPush(p_00,Entry);
    }
    Cec2_ObjSetSatId(p,pObj,iVar1);
    if ((~*(uint *)pObj & 0x1fffffff) != 0 && -1 < (int)*(uint *)pObj) {
      Vec_PtrPush(vFrontier,pObj);
      return;
    }
  }
  return;
}

Assistant:

void Cec2_ObjAddToFrontier( Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Ptr_t * vFrontier, satoko_t * pSat )
{
    int iVar;
    assert( !Gia_IsComplement(pObj) );
    assert( !Gia_ObjIsConst0(pObj) );
    if ( Cec2_ObjSatId(p, pObj) >= 0 )
        return;
    assert( Cec2_ObjSatId(p, pObj) == -1 );
    iVar = satoko_add_variable(pSat, 0);
    if ( p->vVar2Obj )
    {
        assert( Vec_IntSize(p->vVar2Obj) == iVar );
        Vec_IntPush( p->vVar2Obj, Gia_ObjId(p, pObj) );
    }
    Cec2_ObjSetSatId( p, pObj, iVar );
    if ( Gia_ObjIsAnd(pObj) )
        Vec_PtrPush( vFrontier, pObj );
}